

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::ReadShader(MD3Importer *this,ShaderData *fill)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long local_118;
  size_type st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string model_file;
  size_type s;
  ShaderData *fill_local;
  MD3Importer *this_local;
  
  std::__cxx11::string::length();
  model_file.field_2._8_8_ = std::__cxx11::string::find_last_of((char *)&this->path,0xc6a4c3);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_40,(ulong)&this->path);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    std::operator+(&local_a0,&this->path,"..\\..\\..\\scripts\\");
    std::operator+(&local_80,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_60,&local_80,".shader");
    bVar1 = Q3Shader::LoadShader(fill,&local_60,this->mIOHandler);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                     &this->path,"..\\..\\..\\scripts\\");
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
                     &this->filename);
      std::operator+(&local_d0,&local_f0,".shader");
      Q3Shader::LoadShader(fill,&local_d0,this->mIOHandler);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&st);
    }
  }
  else {
    local_118 = std::__cxx11::string::find_last_of((char)this + -0x60,0x2e);
    if (local_118 == -1) {
      std::operator+(&local_158,&this->configShaderFile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_138,&local_158,".shader");
      bVar1 = Q3Shader::LoadShader(fill,&local_138,this->mIOHandler);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::operator+(&local_198,&this->configShaderFile,&this->filename);
        std::operator+(&local_178,&local_198,".shader");
        Q3Shader::LoadShader(fill,&local_178,this->mIOHandler);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
      }
    }
    else {
      Q3Shader::LoadShader(fill,&this->configShaderFile,this->mIOHandler);
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void MD3Importer::ReadShader(Q3Shader::ShaderData& fill) const
{
    // Determine Q3 model name from given path
    const std::string::size_type s = path.find_last_of("\\/",path.length()-2);
    const std::string model_file = path.substr(s+1,path.length()-(s+2));

    // If no specific dir or file is given, use our default search behaviour
    if (!configShaderFile.length()) {
        if(!Q3Shader::LoadShader(fill,path + "..\\..\\..\\scripts\\" + model_file + ".shader",mIOHandler)) {
            Q3Shader::LoadShader(fill,path + "..\\..\\..\\scripts\\" + filename + ".shader",mIOHandler);
        }
    }
    else {
        // If the given string specifies a file, load this file.
        // Otherwise it's a directory.
        const std::string::size_type st = configShaderFile.find_last_of('.');
        if (st == std::string::npos) {

            if(!Q3Shader::LoadShader(fill,configShaderFile + model_file + ".shader",mIOHandler)) {
                Q3Shader::LoadShader(fill,configShaderFile + filename + ".shader",mIOHandler);
            }
        }
        else {
            Q3Shader::LoadShader(fill,configShaderFile,mIOHandler);
        }
    }
}